

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupColVals(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pnVar4;
  const_iterator __position;
  int *piVar5;
  type_conflict5 tVar6;
  long lVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  long lVar8;
  cpp_dec_float<50U,_int,_void> *v;
  int *piVar9;
  int iVar10;
  int local_f0;
  cpp_dec_float<50U,_int,_void> local_e0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  int local_80;
  undefined1 local_7c;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  this_00 = &(this->u).col.val;
  pnVar4 = (this->u).col.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pnVar4 != (this->u).col.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->u).col.val.
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pnVar4;
  }
  local_f0 = this->thedim;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reserve(this_00,(long)(this->u).col.size);
  __position._M_current =
       (this->u).col.val.
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  iVar1 = (this->u).col.size;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_e0,0,(type *)0x0);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::insert(this_00,__position,(long)iVar1,(value_type *)&local_e0);
  piVar9 = (this->u).col.len;
  for (lVar8 = 0; lVar8 < this->thedim; lVar8 = lVar8 + 1) {
    piVar9[lVar8] = 0;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_e0,0.0,(type *)0x0);
  *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 8) = local_e0.data._M_elems._32_8_;
  *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 4) = local_e0.data._M_elems._16_8_;
  *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 6) = local_e0.data._M_elems._24_8_;
  *(undefined8 *)(this->maxabs).m_backend.data._M_elems = local_e0.data._M_elems._0_8_;
  *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 2) = local_e0.data._M_elems._8_8_;
  (this->maxabs).m_backend.exp = local_e0.exp;
  (this->maxabs).m_backend.neg = local_e0.neg;
  (this->maxabs).m_backend.fpclass = local_e0.fpclass;
  (this->maxabs).m_backend.prec_elem = local_e0.prec_elem;
  for (lVar8 = 0; lVar8 < this->thedim; lVar8 = lVar8 + 1) {
    iVar1 = (this->u).row.start[lVar8];
    piVar9 = (this->u).row.idx + iVar1;
    v = &(this->u).row.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[iVar1].m_backend;
    iVar1 = (this->u).row.len[lVar8];
    for (iVar10 = iVar1; 0 < iVar10; iVar10 = iVar10 + -1) {
      iVar2 = *piVar9;
      piVar5 = (this->u).col.len;
      iVar3 = piVar5[iVar2];
      lVar7 = (long)(this->u).col.start[iVar2] + (long)iVar3;
      piVar5[iVar2] = iVar3 + 1;
      (this->u).col.idx[lVar7] = (int)lVar8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&(this->u).col.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar7].m_backend,v);
      local_68 = *(undefined8 *)(v->data)._M_elems;
      uStack_60 = *(undefined8 *)((v->data)._M_elems + 2);
      local_58 = *(undefined8 *)((v->data)._M_elems + 4);
      uStack_50 = *(undefined8 *)((v->data)._M_elems + 6);
      local_48 = *(undefined8 *)((v->data)._M_elems + 8);
      local_40 = v->exp;
      local_3c = v->neg;
      local_38._0_4_ = v->fpclass;
      local_38._4_4_ = v->prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((type *)&local_e0,(multiprecision *)&local_68,arg);
      tVar6 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_e0,&this->maxabs);
      if (tVar6) {
        local_a8 = *(undefined8 *)(v->data)._M_elems;
        uStack_a0 = *(undefined8 *)((v->data)._M_elems + 2);
        local_98 = *(undefined8 *)((v->data)._M_elems + 4);
        uStack_90 = *(undefined8 *)((v->data)._M_elems + 6);
        local_88 = *(undefined8 *)((v->data)._M_elems + 8);
        local_80 = v->exp;
        local_7c = v->neg;
        local_78._0_4_ = v->fpclass;
        local_78._4_4_ = v->prec_elem;
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((type *)&local_e0,(multiprecision *)&local_a8,arg_00);
        *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 8) = local_e0.data._M_elems._32_8_;
        *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 4) = local_e0.data._M_elems._16_8_;
        *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 6) = local_e0.data._M_elems._24_8_;
        *(undefined8 *)(this->maxabs).m_backend.data._M_elems = local_e0.data._M_elems._0_8_;
        *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 2) = local_e0.data._M_elems._8_8_;
        (this->maxabs).m_backend.exp = local_e0.exp;
        (this->maxabs).m_backend.neg = local_e0.neg;
        (this->maxabs).m_backend.fpclass = local_e0.fpclass;
        (this->maxabs).m_backend.prec_elem = local_e0.prec_elem;
      }
      piVar9 = piVar9 + 1;
      v = v + 1;
    }
    local_f0 = local_f0 + iVar1;
  }
  return local_f0;
}

Assistant:

int CLUFactor<R>::setupColVals()
{
   int i;
   int n = thedim;

   if(!u.col.val.empty())
      u.col.val.clear();

   u.col.val.reserve(u.col.size); // small performance improvement before the insertion
   u.col.val.insert(u.col.val.begin(), u.col.size, 0);

   for(i = 0; i < thedim; i++)
      u.col.len[i] = 0;

   maxabs = R(0.0);

   for(i = 0; i < thedim; i++)
   {
      int     k   = u.row.start[i];
      int*    idx = &u.row.idx[k];
      R*   val = &u.row.val[k];
      int     len = u.row.len[i];

      n += len;

      while(len-- > 0)
      {
         assert((*idx >= 0) && (*idx < thedim));

         k = u.col.start[*idx] + u.col.len[*idx];

         assert((k >= 0) && (k < u.col.size));

         u.col.len[*idx]++;

         assert(u.col.len[*idx] <= u.col.max[*idx]);

         u.col.idx[k] = i;
         u.col.val[k] = *val;

         if(spxAbs(*val) > maxabs)
            maxabs = spxAbs(*val);

         idx++;

         val++;
      }
   }

   return n;
}